

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix.cpp
# Opt level: O3

Matrix __thiscall Matrix::operator+(Matrix *this,Matrix *other)

{
  int iVar1;
  int iVar2;
  long lVar3;
  void *__src;
  double *pdVar4;
  runtime_error *this_00;
  long *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  uint uVar6;
  ulong uVar7;
  Matrix MVar8;
  
  iVar1 = *(int *)((long)in_RDX + 0xc);
  if ((iVar1 == other->cols) && (iVar2 = (int)in_RDX[1], iVar2 == other->rows)) {
    uVar6 = iVar2 * iVar1;
    uVar7 = 0xffffffffffffffff;
    if (-1 < (int)uVar6) {
      uVar7 = (long)(int)uVar6 * 8;
    }
    __src = operator_new__(uVar7);
    if (0 < (int)uVar6) {
      pdVar4 = other->data;
      lVar3 = *in_RDX;
      uVar7 = 0;
      do {
        *(double *)((long)__src + uVar7 * 8) = pdVar4[uVar7] + *(double *)(lVar3 + uVar7 * 8);
        uVar7 = uVar7 + 1;
      } while (uVar6 != uVar7);
    }
    this->rows = iVar2;
    this->cols = iVar1;
    uVar7 = 0xffffffffffffffff;
    if (-1 < (int)uVar6) {
      uVar7 = (ulong)uVar6 << 3;
    }
    pdVar4 = (double *)operator_new__(uVar7);
    this->data = pdVar4;
    uVar5 = extraout_RDX;
    if (uVar6 != 0) {
      memcpy(pdVar4,__src,(long)(int)uVar6 * 8);
      uVar5 = extraout_RDX_00;
    }
    MVar8.rows = (int)uVar5;
    MVar8.cols = (int)((ulong)uVar5 >> 0x20);
    MVar8.data = (double *)this;
    return MVar8;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Unsupported sizes");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Matrix Matrix::operator+(const Matrix& other) const
{
    if (other.cols != cols || other.rows != rows)
    {
        throw std::runtime_error("Unsupported sizes");
    }

    auto* aData = new double[rows * cols];
    for (int i = 0; i < rows * cols; ++i)
    {
        aData[i] = data[i] + other.data[i];
    }

    return FromArray(aData, rows, cols);
}